

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O0

void PlaySoundObject(int no,int mode)

{
  int mode_local;
  int no_local;
  
  if ((audio_backend_initialised) && (lpSECONDARYBUFFER[no] != (AudioBackend_Sound *)0x0)) {
    if (mode == -1) {
      AudioBackend_PlaySound(lpSECONDARYBUFFER[no],true);
    }
    else if (mode == 0) {
      AudioBackend_StopSound(lpSECONDARYBUFFER[no]);
    }
    else if (mode == 1) {
      AudioBackend_StopSound(lpSECONDARYBUFFER[no]);
      AudioBackend_RewindSound(lpSECONDARYBUFFER[no]);
      AudioBackend_PlaySound(lpSECONDARYBUFFER[no],false);
    }
  }
  return;
}

Assistant:

void PlaySoundObject(int no, int mode)
{
	if (!audio_backend_initialised)
		return;

	if (lpSECONDARYBUFFER[no] != NULL)
	{
		switch (mode)
		{
			case 0:	// 停止 (Stop)
				AudioBackend_StopSound(lpSECONDARYBUFFER[no]);
				break;

			case 1:	// 再生 (Playback)
				AudioBackend_StopSound(lpSECONDARYBUFFER[no]);
				AudioBackend_RewindSound(lpSECONDARYBUFFER[no]);
				AudioBackend_PlaySound(lpSECONDARYBUFFER[no], FALSE);
				break;

			case -1:// ループ再生 (Loop playback)
				AudioBackend_PlaySound(lpSECONDARYBUFFER[no], TRUE);
				break;
		}
	}
}